

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O2

void cali_set_global_string_byname(char *name,char *val)

{
  size_t sVar1;
  allocator<char> local_69;
  cali_variant_t local_68;
  Attribute attr;
  Caliper c;
  
  cali::Caliper::Caliper(&c);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,name,&local_69);
  attr = cali::Caliper::create_attribute
                   (&c,(string *)&local_68,CALI_TYPE_STRING,0x640,0,(Attribute *)0x0,(Variant *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_68);
  sVar1 = strlen(val);
  local_68 = cali_make_variant(CALI_TYPE_STRING,val,sVar1 + 1);
  cali::Caliper::set(&c,&attr,(Variant *)&local_68);
  return;
}

Assistant:

void cali_set_global_string_byname(const char* name, const char* val)
{
    Caliper   c;
    Attribute attr =
        c.create_attribute(name, CALI_TYPE_STRING, CALI_ATTR_GLOBAL | CALI_ATTR_UNALIGNED | CALI_ATTR_SKIP_EVENTS);

    // TODO: check for existing incompatible attribute key

    c.set(attr, Variant(CALI_TYPE_STRING, val, strlen(val) + 1));
}